

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cc
# Opt level: O3

void __thiscall
tchecker::system::attributes_t::add_attributes(attributes_t *this,attributes_t *attr)

{
  _Hash_node_base *p_Var1;
  attr_parsing_position_t local_70;
  
  p_Var1 = (attr->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      attr_parsing_position_t::attr_parsing_position_t
                (&local_70,(attr_parsing_position_t *)(p_Var1 + 0xd));
      add_attribute(this,(string *)(p_Var1 + 5),(string *)(p_Var1 + 9),&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.super_attr_parsing_position_t._value_position._M_dataplus._M_p !=
          &local_70.super_attr_parsing_position_t._value_position.field_2) {
        operator_delete(local_70.super_attr_parsing_position_t._value_position._M_dataplus._M_p,
                        local_70.super_attr_parsing_position_t._value_position.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.super_attr_parsing_position_t._key_position._M_dataplus._M_p !=
          &local_70.super_attr_parsing_position_t._key_position.field_2) {
        operator_delete(local_70.super_attr_parsing_position_t._key_position._M_dataplus._M_p,
                        local_70.super_attr_parsing_position_t._key_position.field_2.
                        _M_allocated_capacity + 1);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void attributes_t::add_attributes(tchecker::system::attributes_t const & attr)
{
  for (auto && attr : attr.range())
    add_attribute(attr.key(), attr.value(), attr.parsing_position());
}